

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int ns_vprintf(ns_connection *nc,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  char **ppcStack_220;
  int len;
  char *buf;
  char mem [500];
  __va_list_tag *ap_local;
  char *fmt_local;
  ns_connection *nc_local;
  
  ppcStack_220 = &buf;
  unique0x10000072 = ap;
  iVar1 = ns_avprintf((char **)&stack0xfffffffffffffde0,500,fmt,ap);
  if (0 < iVar1) {
    ns_out(nc,ppcStack_220,(long)iVar1);
  }
  if ((ppcStack_220 != &buf) && (ppcStack_220 != (char **)0x0)) {
    free(ppcStack_220);
  }
  return iVar1;
}

Assistant:

int ns_vprintf(struct ns_connection *nc, const char *fmt, va_list ap) {
  char mem[NS_VPRINTF_BUFFER_SIZE], *buf = mem;
  int len;

  if ((len = ns_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
    ns_out(nc, buf, len);
  }
  if (buf != mem && buf != NULL) {
    free(buf);
  }

  return len;
}